

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O3

void __thiscall helics::ValueFederateManager::clearUpdates(ValueFederateManager *this)

{
  uint uVar1;
  Input **ppIVar2;
  long lVar3;
  uint uVar4;
  Input *this_00;
  uint uVar5;
  Input **ppIVar6;
  Input **ppIVar7;
  handle local_40;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_40,&this->inputs);
  if (((local_40.data)->dataStorage).csize == 0) {
    uVar1 = ((local_40.data)->dataStorage).bsize;
    ppIVar2 = ((local_40.data)->dataStorage).dataptr;
    if ((long)(int)uVar1 == 0x20) {
      lVar3 = (long)((local_40.data)->dataStorage).dataSlotIndex;
      if (ppIVar2 == (Input **)0x0) {
        ppIVar7 = (Input **)
                  &gmlc::containers::
                   StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::end()::
                   emptyValue;
      }
      else {
        ppIVar7 = ppIVar2 + lVar3 + 1;
      }
      this_00 = *ppIVar7;
      uVar1 = 0;
      uVar4 = 0x20;
    }
    else {
      lVar3 = (long)((local_40.data)->dataStorage).dataSlotIndex;
      ppIVar7 = ppIVar2 + lVar3;
      this_00 = *ppIVar7 + (int)uVar1;
      uVar4 = uVar1;
    }
  }
  else {
    ppIVar2 = ((local_40.data)->dataStorage).dataptr;
    this_00 = *ppIVar2;
    lVar3 = (long)((local_40.data)->dataStorage).dataSlotIndex;
    uVar1 = 0;
    ppIVar7 = ppIVar2;
    uVar4 = ((local_40.data)->dataStorage).bsize;
  }
  if (ppIVar2 == (Input **)0x0) {
    ppIVar6 = (Input **)
              &gmlc::containers::StableBlockVector<helics::Input,5u,std::allocator<helics::Input>>::
               end()::emptyValue;
  }
  else {
    ppIVar6 = ppIVar2 + lVar3 + 1;
  }
  uVar5 = 0;
  if (uVar4 != 0x20) {
    ppIVar6 = ppIVar2 + lVar3;
    uVar5 = uVar4;
  }
  while ((uVar1 != uVar5 || (ppIVar7 != ppIVar6))) {
    Input::clearUpdate(this_00);
    if ((int)uVar1 < 0x1f) {
      this_00 = this_00 + 1;
      uVar1 = uVar1 + 1;
    }
    else {
      ppIVar7 = ppIVar7 + (ulong)(uVar1 - 0x1f >> 5) + 1;
      uVar1 = uVar1 + 1 & 0x1f;
      this_00 = *ppIVar7 + uVar1;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40.m_handle_lock);
  return;
}

Assistant:

void ValueFederateManager::clearUpdates()
{
    inputs.lock()->apply([](auto& inp) { inp.clearUpdate(); });
}